

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,StringPiece *value)

{
  char *pcVar1;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  pcVar1 = value->ptr_;
  if (pcVar1 == (char *)0x0) {
    local_30 = &local_20;
    local_28 = 0;
    local_20 = 0;
  }
  else {
    local_30 = &local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,pcVar1,pcVar1 + value->length_);
  }
  std::__cxx11::string::_M_append((char *)&this->message_,(ulong)local_30);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const StringPiece& value) {
  message_ += value.ToString();
  return *this;
}